

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::renderTriangleTest(TestStatus *__return_storage_ptr__,Context *context)

{
  float r;
  float g;
  float b;
  deUint64 dVar1;
  VkCommandBuffer_s *pVVar2;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_01;
  RefData<vk::Handle<(vk::HandleType)8>_> data_02;
  RefData<vk::Handle<(vk::HandleType)8>_> data_03;
  RefData<vk::Handle<(vk::HandleType)9>_> data_04;
  RefData<vk::Handle<(vk::HandleType)17>_> data_05;
  RefData<vk::Handle<(vk::HandleType)13>_> data_06;
  RefData<vk::Handle<(vk::HandleType)16>_> data_07;
  RefData<vk::Handle<(vk::HandleType)14>_> data_08;
  RefData<vk::Handle<(vk::HandleType)14>_> data_09;
  RefData<vk::Handle<(vk::HandleType)18>_> data_10;
  RefData<vk::Handle<(vk::HandleType)23>_> data_11;
  RefData<vk::Handle<(vk::HandleType)24>_> data_12;
  RefData<vk::VkCommandBuffer_s_*> data_13;
  RefData<vk::Handle<(vk::HandleType)6>_> data_14;
  bool bVar3;
  VkResult VVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar8;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice;
  Handle<(vk::HandleType)8> *pHVar9;
  Allocation *pAVar10;
  VkDeviceMemory VVar11;
  VkDeviceSize VVar12;
  Handle<(vk::HandleType)9> *pHVar13;
  ProgramCollection<vk::ProgramBinary> *pPVar14;
  ProgramBinary *pPVar15;
  Handle<(vk::HandleType)14> *pHVar16;
  Handle<(vk::HandleType)16> *pHVar17;
  Handle<(vk::HandleType)17> *pHVar18;
  Handle<(vk::HandleType)24> *pHVar19;
  VkCommandBuffer_s **ppVVar20;
  float *pfVar21;
  Handle<(vk::HandleType)23> *pHVar22;
  Handle<(vk::HandleType)18> *pHVar23;
  void *pvVar24;
  Handle<(vk::HandleType)6> *pHVar25;
  TestContext *this;
  TestLog *log;
  SimpleAllocator *pSVar26;
  VkClearValue VVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  allocator<char> local_1481;
  string local_1480;
  undefined4 local_1460;
  allocator<char> local_1459;
  string local_1458;
  ConstPixelBufferAccess local_1438;
  PixelBufferAccess local_1410;
  PixelBufferAccess local_13e8;
  undefined1 local_13bc [8];
  IVec3 posDeviation;
  UVec4 threshold;
  TextureLevel refImage;
  ConstPixelBufferAccess resultAccess;
  VkMappedMemoryRange range_1;
  TextureFormat tcuFormat;
  Move<vk::Handle<(vk::HandleType)6>_> local_1318;
  RefData<vk::Handle<(vk::HandleType)6>_> local_12f8;
  undefined1 local_12d8 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkSubmitInfo submitInfo;
  undefined1 auStack_1268 [8];
  VkFenceCreateInfo fenceParams;
  void *vertexBufPtr;
  VkMappedMemoryRange range;
  VkBufferMemoryBarrier copyFinishBarrier;
  undefined8 local_11d0;
  VkBufferImageCopy copyParams;
  VkImageMemoryBarrier renderFinishBarrier;
  VkDeviceSize bindingOffset;
  undefined4 local_1140 [2];
  VkRenderPassBeginInfo passBeginParams;
  VkClearValue clearValue;
  VkImageMemoryBarrier colorAttBarrier;
  VkMemoryBarrier vertFlushBarrier;
  undefined8 uStack_1088;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  Move<vk::VkCommandBuffer_s_*> local_1060;
  RefData<vk::VkCommandBuffer_s_*> local_1040;
  undefined1 local_1020 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuf;
  VkCommandBufferAllocateInfo cmdBufParams;
  RefData<vk::Handle<(vk::HandleType)24>_> local_fc0;
  undefined1 local_fa0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  RefData<vk::Handle<(vk::HandleType)23>_> local_f48;
  undefined1 local_f28 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  VkFramebufferCreateInfo framebufferParams;
  Move<vk::Handle<(vk::HandleType)18>_> local_ec0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_ea0;
  undefined1 local_e80 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkPipelineColorBlendStateCreateInfo blendParams;
  VkPipelineColorBlendAttachmentState attBlendParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkVertexInputBindingDescription vertexBinding0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  undefined1 local_c90 [4];
  VkSampleMask sampleMask;
  VkPipelineViewportStateCreateInfo viewportParams;
  VkRect2D scissor0;
  VkViewport viewport0;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  undefined4 local_bc8 [2];
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  VkSpecializationInfo emptyShaderSpecParams;
  string local_b40;
  Move<vk::Handle<(vk::HandleType)14>_> local_b20;
  RefData<vk::Handle<(vk::HandleType)14>_> local_b00;
  undefined1 local_ae0 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> fragShaderModule;
  string local_ab8;
  Move<vk::Handle<(vk::HandleType)14>_> local_a98;
  RefData<vk::Handle<(vk::HandleType)14>_> local_a78;
  undefined1 local_a58 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> vertShaderModule;
  RefData<vk::Handle<(vk::HandleType)16>_> local_a18;
  undefined1 local_9f8 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  RefData<vk::Handle<(vk::HandleType)13>_> local_988;
  undefined1 local_968 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttView;
  VkImageViewCreateInfo colorAttViewParams;
  RefData<vk::Handle<(vk::HandleType)17>_> local_8d8;
  undefined1 local_8b8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription subpassDesc;
  VkAttachmentReference colorAttRef;
  VkAttachmentDescription colorAttDesc;
  VkMemoryRequirements local_7c0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_7a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_798;
  undefined1 local_788 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> imageMemory;
  RefData<vk::Handle<(vk::HandleType)9>_> local_758;
  undefined1 local_738 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> image;
  VkImageCreateInfo imageParams;
  VkMemoryRequirements local_6a0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_688;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_678;
  undefined1 local_668 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> readImageBufferMemory;
  RefData<vk::Handle<(vk::HandleType)8>_> local_638;
  undefined1 local_618 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> readImageBuffer;
  VkBufferCreateInfo readImageBufferParams;
  VkDeviceSize imageSizeBytes;
  VkMemoryRequirements local_598;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_580;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_570;
  undefined1 local_560 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> vertexBufferMemory;
  RefData<vk::Handle<(vk::HandleType)8>_> local_530;
  undefined1 local_510 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> vertexBuffer;
  VkBufferCreateInfo vertexBufferParams;
  Vec4 vertices [3];
  Vec4 clearColor;
  VkFormat colorFormat;
  Vector<int,_2> local_468;
  IVec2 renderSize;
  undefined1 local_258 [8];
  SimpleAllocator memAlloc;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  pVVar8 = Context::getUniversalQueue(context);
  memAlloc.m_memProps.memoryHeaps[0xf]._12_4_ = Context::getUniversalQueueFamilyIndex(context);
  vk_01 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&renderSize,vk_01,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            ((SimpleAllocator *)local_258,vk_00,device,
             (VkPhysicalDeviceMemoryProperties *)&renderSize);
  tcu::Vector<int,_2>::Vector(&local_468,0x100,0x100);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices[2].m_data + 2),0.125,0.25,0.75,1.0);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&vertexBufferParams.pQueueFamilyIndices,-0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices[0].m_data + 2),0.5,-0.5,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(vertices[1].m_data + 2),0.0,0.5,0.0,1.0);
  vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ = 0xc;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexBufferParams._4_4_ = 0;
  vertexBufferParams.pNext._0_4_ = 0;
  vertexBufferParams.flags = 0x30;
  vertexBufferParams._20_4_ = 0;
  vertexBufferParams.size._0_4_ = 0x80;
  vertexBufferParams.size._4_4_ = 0;
  vertexBufferParams.usage = 1;
  vertexBufferParams._40_8_ = &memAlloc.m_memProps.memoryHeaps[0xf].field_0xc;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                     &vertexBufferMemory.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8,vk_00,device,
                     (VkBufferCreateInfo *)
                     &vertexBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_530,
             (Move *)&vertexBufferMemory.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar28 = SUB84(local_530.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_530.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_deviceIface._0_4_ = uVar28;
  data_02.object.m_internal = local_530.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = uVar29;
  data_02.deleter.m_device._0_4_ = (int)local_530.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_530.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_530.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_530.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_510,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &vertexBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_510);
  ::vk::getBufferMemoryRequirements(&local_598,vk_00,device,(VkBuffer)pHVar9->m_internal);
  pSVar26 = (SimpleAllocator *)local_258;
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_580,pSVar26,
             &local_598,::vk::MemoryRequirement::HostVisible);
  local_570 = de::details::MovePtr::operator_cast_to_PtrData(&local_580,(MovePtr *)pSVar26);
  data._8_4_ = uVar28;
  data.ptr = (Allocation *)local_530.object.m_internal;
  data._12_4_ = uVar29;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_580);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_510);
  dVar1 = pHVar9->m_internal;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560)
  ;
  VVar11 = ::vk::Allocation::getMemory(pAVar10);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560)
  ;
  VVar12 = ::vk::Allocation::getOffset(pAVar10);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar1,VVar11.m_internal,VVar12);
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x16a);
  iVar5 = tcu::Vector<int,_2>::x(&local_468);
  iVar6 = tcu::Vector<int,_2>::y(&local_468);
  readImageBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
       0xc;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                     &readImageBufferMemory.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8,vk_00,device,
                     (VkBufferCreateInfo *)
                     &readImageBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_638,
             (Move *)&readImageBufferMemory.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar28 = SUB84(local_638.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_638.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_deviceIface._0_4_ = uVar28;
  data_03.object.m_internal = local_638.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = uVar29;
  data_03.deleter.m_device._0_4_ = (int)local_638.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_638.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_638.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_638.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_618,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &readImageBufferMemory.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
            );
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_618);
  ::vk::getBufferMemoryRequirements(&local_6a0,vk_00,device,(VkBuffer)pHVar9->m_internal);
  pSVar26 = (SimpleAllocator *)local_258;
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_688,pSVar26,
             &local_6a0,::vk::MemoryRequirement::HostVisible);
  local_678 = de::details::MovePtr::operator_cast_to_PtrData(&local_688,(MovePtr *)pSVar26);
  data_00._8_4_ = uVar28;
  data_00.ptr = (Allocation *)local_638.object.m_internal;
  data_00._12_4_ = uVar29;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668,data_00);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_688);
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_618);
  dVar1 = pHVar9->m_internal;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668)
  ;
  VVar11 = ::vk::Allocation::getMemory(pAVar10);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668)
  ;
  VVar12 = ::vk::Allocation::getOffset(pAVar10);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0xc])(vk_00,device,dVar1,VVar11.m_internal,VVar12);
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x17b);
  image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator._0_4_ = 0xe;
  tcu::Vector<int,_2>::x(&local_468);
  tcu::Vector<int,_2>::y(&local_468);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)
                    &imageMemory.
                     super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     field_0x8,vk_00,device,
                    (VkImageCreateInfo *)
                    &image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_758,
             (Move *)&imageMemory.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      field_0x8);
  uVar28 = SUB84(local_758.deleter.m_deviceIface,0);
  uVar29 = (undefined4)((ulong)local_758.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_deviceIface._0_4_ = uVar28;
  data_04.object.m_internal = local_758.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = uVar29;
  data_04.deleter.m_device._0_4_ = (int)local_758.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_758.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_758.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_758.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_738,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)
             &imageMemory.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.field_0x8);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  ::vk::getImageMemoryRequirements(&local_7c0,vk_00,device,(VkImage)pHVar13->m_internal);
  pSVar26 = (SimpleAllocator *)local_258;
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a8,pSVar26,
             &local_7c0,::vk::MemoryRequirement::Any);
  local_798 = de::details::MovePtr::operator_cast_to_PtrData(&local_7a8,(MovePtr *)pSVar26);
  data_01._8_4_ = uVar28;
  data_01.ptr = (Allocation *)local_758.object.m_internal;
  data_01._12_4_ = uVar29;
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_788,data_01);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_7a8);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  dVar1 = pHVar13->m_internal;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_788)
  ;
  VVar11 = ::vk::Allocation::getMemory(pAVar10);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_788)
  ;
  VVar12 = ::vk::Allocation::getOffset(pAVar10);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0xd])(vk_00,device,dVar1,VVar11.m_internal,VVar12);
  ::vk::checkResult(VVar4,
                    "vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x193);
  colorAttRef.attachment = 0;
  colorAttRef.layout = 0x25;
  subpassDesc.pPreserveAttachments = (deUint32 *)0x200000000;
  subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  subpassDesc.pColorAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.preserveAttachmentCount = 0;
  subpassDesc._60_4_ = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x1;
  subpassDesc._24_8_ = &subpassDesc.pPreserveAttachments;
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator._0_4_ = 0x26;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext._0_4_ = 0;
  renderPassParams.pNext._4_4_ = 1;
  renderPassParams._16_8_ = &colorAttRef;
  renderPassParams.pAttachments._0_4_ = 1;
  renderPassParams._32_8_ = &renderPassParams.pDependencies;
  renderPassParams.pSubpasses._0_4_ = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams._52_4_ = 0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &colorAttViewParams.subresourceRange.layerCount,vk_00,device,
             (VkRenderPassCreateInfo *)
             &renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_8d8,(Move *)&colorAttViewParams.subresourceRange.layerCount);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_8d8.deleter.m_deviceIface;
  data_05.object.m_internal = local_8d8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_8d8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_8d8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_8d8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_8d8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_8d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_8b8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &colorAttViewParams.subresourceRange.layerCount);
  colorAttView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator._0_4_ = 0xf
  ;
  colorAttViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttViewParams._4_4_ = 0;
  colorAttViewParams.pNext._0_4_ = 0;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  colorAttViewParams._16_8_ = pHVar13->m_internal;
  colorAttViewParams.image.m_internal._0_4_ = 1;
  colorAttViewParams.image.m_internal._4_4_ = 0x25;
  colorAttViewParams.viewType = VK_IMAGE_VIEW_TYPE_CUBE;
  colorAttViewParams.format = VK_FORMAT_R5G6B5_UNORM_PACK16;
  colorAttViewParams.components.r = VK_COMPONENT_SWIZZLE_B;
  colorAttViewParams.components.g = VK_COMPONENT_SWIZZLE_A;
  colorAttViewParams.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  colorAttViewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  colorAttViewParams.subresourceRange.aspectMask = 1;
  colorAttViewParams.subresourceRange.baseMipLevel = 0;
  colorAttViewParams.subresourceRange.levelCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineLayoutParams.pPushConstantRanges,
             vk_00,device,
             (VkImageViewCreateInfo *)
             &colorAttView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
             ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_988,(Move *)&pipelineLayoutParams.pPushConstantRanges);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_988.deleter.m_deviceIface;
  data_06.object.m_internal = local_988.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_988.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_988.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_988.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_988.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_988.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_968,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineLayoutParams.pPushConstantRanges);
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineLayoutParams._4_4_ = 0;
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x1e;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &vertShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
              m_allocator,vk_00,device,
             (VkPipelineLayoutCreateInfo *)
             &pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
              m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_a18,
             (Move *)&vertShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter
                      .m_allocator);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_a18.deleter.m_deviceIface;
  data_07.object.m_internal = local_a18.object.m_internal;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a18.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_a18.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_a18.deleter.m_device >> 0x20);
  data_07.deleter.m_allocator._0_4_ = (int)local_a18.deleter.m_allocator;
  data_07.deleter.m_allocator._4_4_ = (int)((ulong)local_a18.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_9f8,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &vertShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
              m_allocator);
  pPVar14 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"vert",
             (allocator<char> *)
             ((long)&fragShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar14,&local_ab8);
  ::vk::createShaderModule(&local_a98,vk_00,device,pPVar15,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_a78,(Move *)&local_a98);
  data_08.deleter.m_deviceIface._0_4_ = (int)local_a78.deleter.m_deviceIface;
  data_08.object.m_internal = local_a78.object.m_internal;
  data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_a78.deleter.m_deviceIface >> 0x20);
  data_08.deleter.m_device._0_4_ = (int)local_a78.deleter.m_device;
  data_08.deleter.m_device._4_4_ = (int)((ulong)local_a78.deleter.m_device >> 0x20);
  data_08.deleter.m_allocator._0_4_ = (int)local_a78.deleter.m_allocator;
  data_08.deleter.m_allocator._4_4_ = (int)((ulong)local_a78.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a58,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_a98);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fragShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                     m_allocator + 7));
  pPVar14 = Context::getBinaryCollection(context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b40,"frag",(allocator<char> *)((long)&emptyShaderSpecParams.pData + 7)
            );
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar14,&local_b40);
  ::vk::createShaderModule(&local_b20,vk_00,device,pPVar15,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b00,(Move *)&local_b20);
  data_09.deleter.m_deviceIface._0_4_ = (int)local_b00.deleter.m_deviceIface;
  data_09.object.m_internal = local_b00.object.m_internal;
  data_09.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b00.deleter.m_deviceIface >> 0x20);
  data_09.deleter.m_device._0_4_ = (int)local_b00.deleter.m_device;
  data_09.deleter.m_device._4_4_ = (int)((ulong)local_b00.deleter.m_device >> 0x20);
  data_09.deleter.m_allocator._0_4_ = (int)local_b00.deleter.m_allocator;
  data_09.deleter.m_allocator._4_4_ = (int)((ulong)local_b00.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_ae0,data_09);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_b20);
  std::__cxx11::string::~string((string *)&local_b40);
  std::allocator<char>::~allocator((allocator<char> *)((long)&emptyShaderSpecParams.pData + 7));
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  emptyShaderSpecParams.dataSize = 0;
  shaderStageParams[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  local_bc8[0] = 0x12;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[0]._4_4_ = 0;
  shaderStageParams[0].pNext._0_4_ = 0;
  shaderStageParams[0].pNext._4_4_ = 1;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_a58);
  shaderStageParams[0]._16_8_ = pHVar16->m_internal;
  shaderStageParams[0].module.m_internal = (long)"pre_main" + 4;
  shaderStageParams[0].pSpecializationInfo._0_4_ = 0x12;
  shaderStageParams[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStageParams[1]._4_4_ = 0;
  shaderStageParams[1].pNext._0_4_ = 0;
  shaderStageParams[1].pNext._4_4_ = 0x10;
  shaderStageParams[0].pName = (char *)&shaderStageParams[1].pSpecializationInfo;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_ae0);
  shaderStageParams[1]._16_8_ = pHVar16->m_internal;
  shaderStageParams[1].module.m_internal = (long)"pre_main" + 4;
  viewport0.minDepth = 3.50325e-44;
  viewport0.maxDepth = 0.0;
  scissor0.extent.width = 0;
  scissor0.extent.height = 0;
  shaderStageParams[1].pName = (char *)&shaderStageParams[1].pSpecializationInfo;
  iVar7 = tcu::Vector<int,_2>::x(&local_468);
  viewport0.x = (float)iVar7;
  iVar7 = tcu::Vector<int,_2>::y(&local_468);
  viewport0.y = (float)iVar7;
  viewport0.width = 0.0;
  viewport0.height = 1.0;
  viewportParams.pScissors._0_4_ = 0;
  viewportParams.pScissors._4_4_ = 0;
  scissor0.offset.x = tcu::Vector<int,_2>::x(&local_468);
  scissor0.offset.y = tcu::Vector<int,_2>::y(&local_468);
  local_c90 = (undefined1  [4])0x16;
  viewportParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportParams._4_4_ = 0;
  viewportParams.pNext._0_4_ = 0;
  viewportParams.pNext._4_4_ = 1;
  viewportParams._16_8_ = &scissor0.extent;
  viewportParams.pViewports._0_4_ = 1;
  viewportParams._32_8_ = &viewportParams.pScissors;
  multisampleParams.alphaToOneEnable = 0xffffffff;
  rasterParams.lineWidth = 3.36312e-44;
  multisampleParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  multisampleParams._4_4_ = 0;
  multisampleParams.pNext._0_4_ = 0;
  multisampleParams.pNext._4_4_ = 1;
  multisampleParams.flags = 0;
  multisampleParams.rasterizationSamples = 0;
  multisampleParams._24_8_ = &multisampleParams.alphaToOneEnable;
  multisampleParams.pSampleMask._0_4_ = 0;
  multisampleParams.pSampleMask._4_4_ = 0;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 0;
  rasterParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  rasterParams._4_4_ = 0;
  inputAssemblyParams.primitiveRestartEnable = 0x17;
  inputAssemblyParams._28_4_ = 0;
  rasterParams.pNext = (void *)0x100000000;
  rasterParams.depthBiasClamp = 1.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  inputAssemblyParams.pNext = (void *)0x300000000;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  stack0xfffffffffffff2d8 = 0x14;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyParams._4_4_ = 0;
  vertexAttrib0.format = VK_FORMAT_UNDEFINED;
  vertexAttrib0.offset = 0x10;
  vertexBinding0.binding = 0;
  vertexInputStateParams.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexAttrib0.location = 0x6d;
  vertexAttrib0.binding = 0;
  attBlendParams.alphaBlendOp = 0x13;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext._0_4_ = 0;
  vertexInputStateParams.pNext._4_4_ = 1;
  vertexInputStateParams._16_8_ = &vertexAttrib0.format;
  vertexInputStateParams.pVertexBindingDescriptions._0_4_ = 1;
  vertexInputStateParams._32_8_ = &vertexInputStateParams.pVertexAttributeDescriptions;
  attBlendParams.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.colorBlendOp = VK_BLEND_OP_ADD;
  attBlendParams.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
  blendParams.blendConstants[2] = 0.0;
  blendParams.blendConstants[3] = 1.4013e-45;
  attBlendParams.blendEnable = 0;
  attBlendParams.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineParams.basePipelineIndex = 0x1a;
  blendParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  blendParams._4_4_ = 0;
  blendParams.pNext._0_4_ = 0;
  blendParams.pNext._4_4_ = 0;
  blendParams.flags = 3;
  blendParams.logicOpEnable = 1;
  blendParams._24_8_ = blendParams.blendConstants + 2;
  blendParams.pAttachments._0_4_ = 0;
  blendParams.pAttachments._4_4_ = 0;
  blendParams.blendConstants[0] = 0.0;
  blendParams.blendConstants[1] = 0.0;
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._0_4_ = 0x1c;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext._0_4_ = 0;
  pipelineParams.pNext._4_4_ = 2;
  pipelineParams._16_8_ = local_bc8;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)&attBlendParams.alphaBlendOp;
  pipelineParams.pVertexInputState =
       (VkPipelineVertexInputStateCreateInfo *)&vertexBinding0.inputRate;
  pipelineParams.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_c90;
  pipelineParams.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&inputAssemblyParams.primitiveRestartEnable;
  pipelineParams.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&rasterParams.lineWidth;
  pipelineParams.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)&viewport0.minDepth;
  pipelineParams.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&pipelineParams.basePipelineIndex;
  pipelineParams.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_9f8);
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pHVar17->m_internal;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_8b8);
  pipelineParams.layout.m_internal = pHVar18->m_internal;
  pipelineParams.renderPass.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineParams.subpass,0);
  pipelineParams.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle
            ((Handle<(vk::HandleType)15> *)&framebufferParams.layers,0);
  ::vk::createGraphicsPipeline
            (&local_ec0,vk_00,device,(VkPipelineCache)framebufferParams._56_8_,
             (VkGraphicsPipelineCreateInfo *)
             &pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_ea0,(Move *)&local_ec0);
  data_10.deleter.m_deviceIface._0_4_ = (int)local_ea0.deleter.m_deviceIface;
  data_10.object.m_internal = local_ea0.object.m_internal;
  data_10.deleter.m_deviceIface._4_4_ = (int)((ulong)local_ea0.deleter.m_deviceIface >> 0x20);
  data_10.deleter.m_device._0_4_ = (int)local_ea0.deleter.m_device;
  data_10.deleter.m_device._4_4_ = (int)((ulong)local_ea0.deleter.m_device >> 0x20);
  data_10.deleter.m_allocator._0_4_ = (int)local_ea0.deleter.m_allocator;
  data_10.deleter.m_allocator._4_4_ = (int)((ulong)local_ea0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_e80,data_10);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_ec0);
  framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator._0_4_ = 0x25
  ;
  framebufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferParams._4_4_ = 0;
  framebufferParams.pNext._0_4_ = 0;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_8b8);
  framebufferParams._16_8_ = pHVar18->m_internal;
  framebufferParams.renderPass.m_internal._0_4_ = 1;
  framebufferParams._32_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                 ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_968);
  framebufferParams.pAttachments._0_4_ = tcu::Vector<int,_2>::x(&local_468);
  framebufferParams.pAttachments._4_4_ = tcu::Vector<int,_2>::y(&local_468);
  framebufferParams.width = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&cmdPoolParams.flags,vk_00,device,
             (VkFramebufferCreateInfo *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_f48,(Move *)&cmdPoolParams.flags);
  data_11.deleter.m_deviceIface._0_4_ = (int)local_f48.deleter.m_deviceIface;
  data_11.object.m_internal = local_f48.object.m_internal;
  data_11.deleter.m_deviceIface._4_4_ = (int)((ulong)local_f48.deleter.m_deviceIface >> 0x20);
  data_11.deleter.m_device._0_4_ = (int)local_f48.deleter.m_device;
  data_11.deleter.m_device._4_4_ = (int)((ulong)local_f48.deleter.m_device >> 0x20);
  data_11.deleter.m_allocator._0_4_ = (int)local_f48.deleter.m_allocator;
  data_11.deleter.m_allocator._4_4_ = (int)((ulong)local_f48.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_f28,data_11);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&cmdPoolParams.flags);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdPoolParams._4_4_ = 0;
  cmdPoolParams.pNext._0_4_ = 2;
  cmdPoolParams.pNext._4_4_ = memAlloc.m_memProps.memoryHeaps[0xf]._12_4_;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufParams.level,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_fc0,(Move *)&cmdBufParams.level);
  data_12.deleter.m_deviceIface._0_4_ = (int)local_fc0.deleter.m_deviceIface;
  data_12.object.m_internal = local_fc0.object.m_internal;
  data_12.deleter.m_deviceIface._4_4_ = (int)((ulong)local_fc0.deleter.m_deviceIface >> 0x20);
  data_12.deleter.m_device._0_4_ = (int)local_fc0.deleter.m_device;
  data_12.deleter.m_device._4_4_ = (int)((ulong)local_fc0.deleter.m_device >> 0x20);
  data_12.deleter.m_allocator._0_4_ = (int)local_fc0.deleter.m_allocator;
  data_12.deleter.m_allocator._4_4_ = (int)((ulong)local_fc0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_fa0,data_12);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&cmdBufParams.level);
  cmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  cmdBufParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufParams._4_4_ = 0;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_fa0);
  cmdBufParams.pNext = (void *)pHVar19->m_internal;
  cmdBufParams.commandPool.m_internal._0_4_ = 0;
  cmdBufParams.commandPool.m_internal._4_4_ = 1;
  ::vk::allocateCommandBuffer
            (&local_1060,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &cmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1040,(Move *)&local_1060);
  data_13.deleter.m_deviceIface._0_4_ = (int)local_1040.deleter.m_deviceIface;
  data_13.object = local_1040.object;
  data_13.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1040.deleter.m_deviceIface >> 0x20);
  data_13.deleter.m_device._0_4_ = (int)local_1040.deleter.m_device;
  data_13.deleter.m_device._4_4_ = (int)((ulong)local_1040.deleter.m_device >> 0x20);
  data_13.deleter.m_pool.m_internal._0_4_ = (int)local_1040.deleter.m_pool.m_internal;
  data_13.deleter.m_pool.m_internal._4_4_ = (int)(local_1040.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1020,data_13);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_1060);
  cmdBufBeginParams.pNext = (void *)0x0;
  cmdBufBeginParams.flags = 0;
  cmdBufBeginParams._20_4_ = 0;
  uStack_1088 = 0x2a;
  cmdBufBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufBeginParams._4_4_ = 0;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar20,&uStack_1088);
  ::vk::checkResult(VVar4,"vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x2de);
  colorAttBarrier.subresourceRange.layerCount = 0x2e;
  colorAttBarrier._68_4_ = 0;
  clearValue._8_4_ = 0x2d;
  colorAttBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttBarrier._4_4_ = 0;
  colorAttBarrier.pNext._0_4_ = 0;
  colorAttBarrier.pNext._4_4_ = 0x180;
  colorAttBarrier.srcAccessMask = 0;
  colorAttBarrier.dstAccessMask = 2;
  colorAttBarrier.oldLayout = memAlloc.m_memProps.memoryHeaps[0xf]._12_4_;
  colorAttBarrier.newLayout = memAlloc.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  colorAttBarrier._32_8_ = pHVar13->m_internal;
  colorAttBarrier.image.m_internal._0_4_ = 1;
  colorAttBarrier.image.m_internal._4_4_ = 0;
  colorAttBarrier.subresourceRange.aspectMask = 1;
  colorAttBarrier.subresourceRange.baseMipLevel = 0;
  colorAttBarrier.subresourceRange.levelCount = 1;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar20,0x4000,0x10000,0,1,&colorAttBarrier.subresourceRange.layerCount,0,0,1,
             (long)&clearValue + 8);
  pfVar21 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(vertices[2].m_data + 2),0);
  r = *pfVar21;
  pfVar21 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(vertices[2].m_data + 2),1);
  g = *pfVar21;
  pfVar21 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(vertices[2].m_data + 2),2);
  b = *pfVar21;
  pfVar21 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(vertices[2].m_data + 2),3);
  VVar27 = ::vk::makeClearValueColorF32(r,g,b,*pfVar21);
  clearValue.depthStencil = (VkClearDepthStencilValue)VVar27._8_8_;
  passBeginParams.pClearValues = (VkClearValue *)VVar27.depthStencil;
  local_1140[0] = 0x2b;
  passBeginParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  passBeginParams._4_4_ = 0;
  pHVar18 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_8b8);
  passBeginParams.pNext = (void *)pHVar18->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_f28);
  passBeginParams.renderPass.m_internal = pHVar22->m_internal;
  passBeginParams.framebuffer.m_internal._0_4_ = 0;
  passBeginParams.framebuffer.m_internal._4_4_ = 0;
  passBeginParams.renderArea.offset.x = tcu::Vector<int,_2>::x(&local_468);
  passBeginParams.renderArea.offset.y = tcu::Vector<int,_2>::y(&local_468);
  passBeginParams.renderArea.extent.width = 1;
  passBeginParams._48_8_ = &passBeginParams.pClearValues;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar20,local_1140,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  pVVar2 = *ppVVar20;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_e80);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar23->m_internal);
  renderFinishBarrier.subresourceRange.layerCount = 0;
  renderFinishBarrier._68_4_ = 0;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  pVVar2 = *ppVVar20;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_510);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,pVVar2,0,1,pHVar9,&renderFinishBarrier.subresourceRange.layerCount);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar20,3,1,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar20);
  copyParams.imageExtent.height = 0x2d;
  renderFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderFinishBarrier._4_4_ = 0;
  renderFinishBarrier.pNext._0_4_ = 0x100;
  renderFinishBarrier.pNext._4_4_ = 0x800;
  renderFinishBarrier.srcAccessMask = 2;
  renderFinishBarrier.dstAccessMask = 6;
  renderFinishBarrier.oldLayout = memAlloc.m_memProps.memoryHeaps[0xf]._12_4_;
  renderFinishBarrier.newLayout = memAlloc.m_memProps.memoryHeaps[0xf]._12_4_;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  renderFinishBarrier._32_8_ = pHVar13->m_internal;
  renderFinishBarrier.image.m_internal._0_4_ = 1;
  renderFinishBarrier.image.m_internal._4_4_ = 0;
  renderFinishBarrier.subresourceRange.aspectMask = 1;
  renderFinishBarrier.subresourceRange.baseMipLevel = 0;
  renderFinishBarrier.subresourceRange.levelCount = 1;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar20,0x8000,0x1000,0,0,0,0,0,1,&copyParams.imageExtent.height);
  local_11d0 = 0;
  copyParams.bufferOffset._0_4_ = tcu::Vector<int,_2>::x(&local_468);
  copyParams.bufferOffset._4_4_ = tcu::Vector<int,_2>::y(&local_468);
  copyParams.bufferRowLength = 1;
  copyParams.bufferImageHeight = 0;
  copyParams.imageSubresource.aspectMask = 0;
  copyParams.imageSubresource.mipLevel = 1;
  copyParams.imageSubresource.baseArrayLayer = 0;
  copyParams.imageSubresource.layerCount = 0;
  copyParams.imageOffset.x = 0;
  copyParams.imageOffset.y = tcu::Vector<int,_2>::x(&local_468);
  copyParams.imageOffset.z = tcu::Vector<int,_2>::y(&local_468);
  copyParams.imageExtent.width = 1;
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  pVVar2 = *ppVVar20;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_738);
  dVar1 = pHVar13->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_618);
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,dVar1,6,pHVar9->m_internal,1,&local_11d0);
  range.size._0_4_ = 0x2c;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_618);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,0x1000,0x4000,0,0,0,1,(int)&range.size,0,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar20);
  ::vk::checkResult(VVar4,"vk.endCommandBuffer(*cmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x359);
  vertexBufPtr._0_4_ = 6;
  range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  range._4_4_ = 0;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560)
  ;
  range.pNext = (void *)::vk::Allocation::getMemory(pAVar10);
  range.memory.m_internal = 0;
  range.offset = 0x30;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560)
  ;
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar10);
  ::deMemcpy(pvVar24,&vertexBufferParams.pQueueFamilyIndices,0x30);
  VVar4 = (*vk_00->_vptr_DeviceInterface[9])(vk_00,device,1,&vertexBufPtr);
  ::vk::checkResult(VVar4,"vk.flushMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x368);
  fenceParams.pNext = (void *)0x0;
  auStack_1268 = (undefined1  [8])0x8;
  fenceParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  fenceParams._4_4_ = 0;
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x4;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
            ((RefBase<vk::VkCommandBuffer_s_*> *)local_1020);
  ::vk::createFence(&local_1318,vk_00,device,(VkFenceCreateInfo *)auStack_1268,
                    (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_12f8,(Move *)&local_1318);
  data_14.deleter.m_deviceIface._0_4_ = (int)local_12f8.deleter.m_deviceIface;
  data_14.object.m_internal = local_12f8.object.m_internal;
  data_14.deleter.m_deviceIface._4_4_ = (int)((ulong)local_12f8.deleter.m_deviceIface >> 0x20);
  data_14.deleter.m_device._0_4_ = (int)local_12f8.deleter.m_device;
  data_14.deleter.m_device._4_4_ = (int)((ulong)local_12f8.deleter.m_device >> 0x20);
  data_14.deleter.m_allocator._0_4_ = (int)local_12f8.deleter.m_allocator;
  data_14.deleter.m_allocator._4_4_ = (int)((ulong)local_12f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_12d8,data_14);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_1318);
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_12d8);
  VVar4 = (*vk_00->_vptr_DeviceInterface[2])
                    (vk_00,pVVar8,1,
                     &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator
                     ,pHVar25->m_internal);
  ::vk::checkResult(VVar4,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x381);
  pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_12d8);
  VVar4 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar25,1,0xffffffffffffffff);
  ::vk::checkResult(VVar4,"vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x382);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_12d8);
  range_1.size = (VkDeviceSize)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  resultAccess.m_data._0_4_ = 6;
  range_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  range_1._4_4_ = 0;
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668)
  ;
  range_1.pNext = (void *)::vk::Allocation::getMemory(pAVar10);
  range_1.memory.m_internal = 0;
  range_1.offset = (long)iVar5 * 4 * (long)iVar6;
  iVar5 = tcu::Vector<int,_2>::x(&local_468);
  iVar6 = tcu::Vector<int,_2>::y(&local_468);
  pAVar10 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                      ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668)
  ;
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar10);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&refImage.m_data.m_cap,(TextureFormat *)&range_1.size,iVar5,
             iVar6,1,pvVar24);
  VVar4 = (*vk_00->_vptr_DeviceInterface[10])(vk_00,device,1,&resultAccess.m_data);
  ::vk::checkResult(VVar4,"vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x392);
  iVar5 = tcu::Vector<int,_2>::x(&local_468);
  iVar6 = tcu::Vector<int,_2>::y(&local_468);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)(threshold.m_data + 2),(TextureFormat *)&range_1.size,iVar5,iVar6,1);
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(posDeviation.m_data + 1),0);
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_13bc,1,1,0);
  tcu::TextureLevel::getAccess(&local_13e8,(TextureLevel *)(threshold.m_data + 2));
  tcu::clear(&local_13e8,(Vec4 *)(vertices[2].m_data + 2));
  tcu::TextureLevel::getAccess(&local_1410,(TextureLevel *)(threshold.m_data + 2));
  renderReferenceTriangle(&local_1410,(Vec4 (*) [3])&vertexBufferParams.pQueueFamilyIndices);
  this = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_1438,(TextureLevel *)(threshold.m_data + 2));
  bVar3 = tcu::intThresholdPositionDeviationCompare
                    (log,"ComparisonResult","Image comparison result",&local_1438,
                     (ConstPixelBufferAccess *)&refImage.m_data.m_cap,
                     (UVec4 *)(posDeviation.m_data + 1),(IVec3 *)local_13bc,false,COMPARE_LOG_RESULT
                    );
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1458,"Rendering succeeded",&local_1459);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1458);
    std::__cxx11::string::~string((string *)&local_1458);
    std::allocator<char>::~allocator(&local_1459);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1480,"Image comparison failed",&local_1481);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1480);
    std::__cxx11::string::~string((string *)&local_1480);
    std::allocator<char>::~allocator(&local_1481);
  }
  local_1460 = 1;
  tcu::TextureLevel::~TextureLevel((TextureLevel *)(threshold.m_data + 2));
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1020);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_fa0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_f28);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_e80);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_ae0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_a58);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_9f8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_968);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_8b8);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_788);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_738);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_668);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_618);
  de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
            ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_560);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_510);
  ::vk::SimpleAllocator::~SimpleAllocator((SimpleAllocator *)local_258);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus renderTriangleTest (Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	SimpleAllocator							memAlloc				(vk, vkDevice, getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()));
	const tcu::IVec2						renderSize				(256, 256);
	const VkFormat							colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const tcu::Vec4							clearColor				(0.125f, 0.25f, 0.75f, 1.0f);

	const tcu::Vec4							vertices[]				=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	const VkBufferCreateInfo				vertexBufferParams		=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		(VkDeviceSize)sizeof(vertices),			// size
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		1u,										// queueFamilyIndexCount
		&queueFamilyIndex,						// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					vertexBuffer			(createBuffer(vk, vkDevice, &vertexBufferParams));
	const UniquePtr<Allocation>				vertexBufferMemory		(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

	const VkDeviceSize						imageSizeBytes			= (VkDeviceSize)(sizeof(deUint32)*renderSize.x()*renderSize.y());
	const VkBufferCreateInfo				readImageBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// sType
		DE_NULL,									// pNext
		(VkBufferCreateFlags)0u,					// flags
		imageSizeBytes,								// size
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// usage
		VK_SHARING_MODE_EXCLUSIVE,					// sharingMode
		1u,											// queueFamilyIndexCount
		&queueFamilyIndex,							// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					readImageBuffer			(createBuffer(vk, vkDevice, &readImageBufferParams));
	const UniquePtr<Allocation>				readImageBufferMemory	(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *readImageBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset()));

	const VkImageCreateInfo					imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,									// sType
		DE_NULL,																// pNext
		0u,																		// flags
		VK_IMAGE_TYPE_2D,														// imageType
		VK_FORMAT_R8G8B8A8_UNORM,												// format
		{ (deUint32)renderSize.x(), (deUint32)renderSize.y(), 1 },				// extent
		1u,																		// mipLevels
		1u,																		// arraySize
		VK_SAMPLE_COUNT_1_BIT,													// samples
		VK_IMAGE_TILING_OPTIMAL,												// tiling
		VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|VK_IMAGE_USAGE_TRANSFER_SRC_BIT,	// usage
		VK_SHARING_MODE_EXCLUSIVE,												// sharingMode
		1u,																		// queueFamilyIndexCount
		&queueFamilyIndex,														// pQueueFamilyIndices
		VK_IMAGE_LAYOUT_UNDEFINED,												// initialLayout
	};

	const Unique<VkImage>					image					(createImage(vk, vkDevice, &imageParams));
	const UniquePtr<Allocation>				imageMemory				(memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any));

	VK_CHECK(vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset()));

	const VkAttachmentDescription			colorAttDesc			=
	{
		0u,												// flags
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		VK_SAMPLE_COUNT_1_BIT,							// samples
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// loadOp
		VK_ATTACHMENT_STORE_OP_STORE,					// storeOp
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// stencilLoadOp
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// stencilStoreOp
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// initialLayout
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// finalLayout
	};
	const VkAttachmentReference				colorAttRef				=
	{
		0u,												// attachment
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// layout
	};
	const VkSubpassDescription				subpassDesc				=
	{
		(VkSubpassDescriptionFlags)0u,					// flags
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// pipelineBindPoint
		0u,												// inputAttachmentCount
		DE_NULL,										// pInputAttachments
		1u,												// colorAttachmentCount
		&colorAttRef,									// pColorAttachments
		DE_NULL,										// pResolveAttachments
		DE_NULL,										// depthStencilAttachment
		0u,												// preserveAttachmentCount
		DE_NULL,										// pPreserveAttachments
	};
	const VkRenderPassCreateInfo			renderPassParams		=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		1u,												// attachmentCount
		&colorAttDesc,									// pAttachments
		1u,												// subpassCount
		&subpassDesc,									// pSubpasses
		0u,												// dependencyCount
		DE_NULL,										// pDependencies
	};
	const Unique<VkRenderPass>				renderPass				(createRenderPass(vk, vkDevice, &renderPassParams));

	const VkImageViewCreateInfo				colorAttViewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		*image,											// image
		VK_IMAGE_VIEW_TYPE_2D,							// viewType
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		{
			VK_COMPONENT_SWIZZLE_R,
			VK_COMPONENT_SWIZZLE_G,
			VK_COMPONENT_SWIZZLE_B,
			VK_COMPONENT_SWIZZLE_A
		},												// components
		{
			VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
			0u,												// baseMipLevel
			1u,												// levelCount
			0u,												// baseArrayLayer
			1u,												// layerCount
		},												// subresourceRange
	};
	const Unique<VkImageView>				colorAttView			(createImageView(vk, vkDevice, &colorAttViewParams));

	// Pipeline layout
	const VkPipelineLayoutCreateInfo		pipelineLayoutParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,			// sType
		DE_NULL,												// pNext
		(vk::VkPipelineLayoutCreateFlags)0,
		0u,														// setLayoutCount
		DE_NULL,												// pSetLayouts
		0u,														// pushConstantRangeCount
		DE_NULL,												// pPushConstantRanges
	};
	const Unique<VkPipelineLayout>			pipelineLayout			(createPipelineLayout(vk, vkDevice, &pipelineLayoutParams));

	// Shaders
	const Unique<VkShaderModule>			vertShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("vert"), 0));
	const Unique<VkShaderModule>			fragShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("frag"), 0));

	// Pipeline
	const VkSpecializationInfo				emptyShaderSpecParams	=
	{
		0u,														// mapEntryCount
		DE_NULL,												// pMap
		0,														// dataSize
		DE_NULL,												// pData
	};
	const VkPipelineShaderStageCreateInfo	shaderStageParams[]	=
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_VERTEX_BIT,								// stage
			*vertShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_FRAGMENT_BIT,							// stage
			*fragShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		}
	};
	const VkPipelineDepthStencilStateCreateInfo	depthStencilParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// depthTestEnable
		DE_FALSE,													// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,										// depthCompareOp
		DE_FALSE,													// depthBoundsTestEnable
		DE_FALSE,													// stencilTestEnable
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// front
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// back;
		0.0f,														//	float				minDepthBounds;
		1.0f,														//	float				maxDepthBounds;
	};
	const VkViewport						viewport0				=
	{
		0.0f,														// x
		0.0f,														// y
		(float)renderSize.x(),										// width
		(float)renderSize.y(),										// height
		0.0f,														// minDepth
		1.0f,														// maxDepth
	};
	const VkRect2D							scissor0				=
	{
		{
			0u,															// x
			0u,															// y
		},															// offset
		{
			(deUint32)renderSize.x(),									// width
			(deUint32)renderSize.y(),									// height
		},															// extent;
	};
	const VkPipelineViewportStateCreateInfo		viewportParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,		// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// viewportCount
		&viewport0,													// pViewports
		1u,															// scissorCount
		&scissor0													// pScissors
	};
	const VkSampleMask							sampleMask				= ~0u;
	const VkPipelineMultisampleStateCreateInfo	multisampleParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_SAMPLE_COUNT_1_BIT,										// rasterizationSamples
		VK_FALSE,													// sampleShadingEnable
		0.0f,														// minSampleShading
		&sampleMask,												// sampleMask
		VK_FALSE,													// alphaToCoverageEnable
		VK_FALSE,													// alphaToOneEnable
	};
	const VkPipelineRasterizationStateCreateInfo	rasterParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_TRUE,													// depthClampEnable
		VK_FALSE,													// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,										// polygonMode
		VK_CULL_MODE_NONE,											// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// frontFace
		VK_FALSE,													// depthBiasEnable
		0.0f,														// depthBiasConstantFactor
		0.0f,														// depthBiasClamp
		0.0f,														// depthBiasSlopeFactor
		1.0f,														// lineWidth
	};
	const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,														// pNext
		0u,																// flags
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		DE_FALSE,														// primitiveRestartEnable
	};
	const VkVertexInputBindingDescription		vertexBinding0			=
	{
		0u,														// binding
		(deUint32)sizeof(tcu::Vec4),							// stride
		VK_VERTEX_INPUT_RATE_VERTEX,							// inputRate
	};
	const VkVertexInputAttributeDescription		vertexAttrib0			=
	{
		0u,														// location
		0u,														// binding
		VK_FORMAT_R32G32B32A32_SFLOAT,							// format
		0u,														// offset
	};
	const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// vertexBindingDescriptionCount
		&vertexBinding0,											// pVertexBindingDescriptions
		1u,															// vertexAttributeDescriptionCount
		&vertexAttrib0,												// pVertexAttributeDescriptions
	};
	const VkPipelineColorBlendAttachmentState	attBlendParams			=
	{
		VK_FALSE,													// blendEnable
		VK_BLEND_FACTOR_ONE,										// srcColorBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstColorBlendFactor
		VK_BLEND_OP_ADD,											// colorBlendOp
		VK_BLEND_FACTOR_ONE,										// srcAlphaBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstAlphaBlendFactor
		VK_BLEND_OP_ADD,											// alphaBlendOp
		(VK_COLOR_COMPONENT_R_BIT|
		 VK_COLOR_COMPONENT_G_BIT|
		 VK_COLOR_COMPONENT_B_BIT|
		 VK_COLOR_COMPONENT_A_BIT),									// colorWriteMask
	};
	const VkPipelineColorBlendStateCreateInfo	blendParams				=
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// logicOpEnable
		VK_LOGIC_OP_COPY,											// logicOp
		1u,															// attachmentCount
		&attBlendParams,											// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// blendConstants[4]
	};
	const VkGraphicsPipelineCreateInfo		pipelineParams			=
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,		// sType
		DE_NULL,												// pNext
		0u,														// flags
		(deUint32)DE_LENGTH_OF_ARRAY(shaderStageParams),		// stageCount
		shaderStageParams,										// pStages
		&vertexInputStateParams,								// pVertexInputState
		&inputAssemblyParams,									// pInputAssemblyState
		DE_NULL,												// pTessellationState
		&viewportParams,										// pViewportState
		&rasterParams,											// pRasterizationState
		&multisampleParams,										// pMultisampleState
		&depthStencilParams,									// pDepthStencilState
		&blendParams,											// pColorBlendState
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,		// pDynamicState
		*pipelineLayout,										// layout
		*renderPass,											// renderPass
		0u,														// subpass
		DE_NULL,												// basePipelineHandle
		0u,														// basePipelineIndex
	};

	const Unique<VkPipeline>				pipeline				(createGraphicsPipeline(vk, vkDevice, DE_NULL, &pipelineParams));

	// Framebuffer
	const VkFramebufferCreateInfo			framebufferParams		=
	{
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,				// sType
		DE_NULL,												// pNext
		0u,														// flags
		*renderPass,											// renderPass
		1u,														// attachmentCount
		&*colorAttView,											// pAttachments
		(deUint32)renderSize.x(),								// width
		(deUint32)renderSize.y(),								// height
		1u,														// layers
	};
	const Unique<VkFramebuffer>				framebuffer				(createFramebuffer(vk, vkDevice, &framebufferParams));

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags
		queueFamilyIndex,											// queueFamilyIndex
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,			// sType
		DE_NULL,												// pNext
		*cmdPool,												// pool
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,						// level
		1u,														// bufferCount
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			cmdBufBeginParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// sType
		DE_NULL,												// pNext
		0u,														// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Record commands
	VK_CHECK(vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams));

	{
		const VkMemoryBarrier		vertFlushBarrier	=
		{
			VK_STRUCTURE_TYPE_MEMORY_BARRIER,			// sType
			DE_NULL,									// pNext
			VK_ACCESS_HOST_WRITE_BIT,					// srcAccessMask
			VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT,		// dstAccessMask
		};
		const VkImageMemoryBarrier	colorAttBarrier		=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			0u,											// srcAccessMask
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),		// dstAccessMask
			VK_IMAGE_LAYOUT_UNDEFINED,					// oldLayout
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// levelCount
				0u,											// baseArrayLayer
				1u,											// layerCount
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, (VkDependencyFlags)0, 1, &vertFlushBarrier, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &colorAttBarrier);
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(clearColor[0],
																			 clearColor[1],
																			 clearColor[2],
																			 clearColor[3]);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,			// sType
			DE_NULL,											// pNext
			*renderPass,										// renderPass
			*framebuffer,										// framebuffer
			{
				{ 0, 0 },
				{ (deUint32)renderSize.x(), (deUint32)renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		vk.cmdBeginRenderPass(*cmdBuf, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	vk.cmdBindPipeline(*cmdBuf, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkDeviceSize bindingOffset = 0;
		vk.cmdBindVertexBuffers(*cmdBuf, 0u, 1u, &vertexBuffer.get(), &bindingOffset);
	}
	vk.cmdDraw(*cmdBuf, 3u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuf);

	{
		const VkImageMemoryBarrier	renderFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// outputMask
			VK_ACCESS_TRANSFER_READ_BIT,				// inputMask
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// oldLayout
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// mipLevels
				0u,											// baseArraySlice
				1u,											// arraySize
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &renderFinishBarrier);
	}

	{
		const VkBufferImageCopy	copyParams	=
		{
			(VkDeviceSize)0u,						// bufferOffset
			(deUint32)renderSize.x(),				// bufferRowLength
			(deUint32)renderSize.y(),				// bufferImageHeight
			{
				VK_IMAGE_ASPECT_COLOR_BIT,				// aspectMask
				0u,										// mipLevel
				0u,										// baseArrayLayer
				1u,										// layerCount
			},										// imageSubresource
			{ 0u, 0u, 0u },							// imageOffset
			{
				(deUint32)renderSize.x(),
				(deUint32)renderSize.y(),
				1u
			}										// imageExtent
		};
		vk.cmdCopyImageToBuffer(*cmdBuf, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	{
		const VkBufferMemoryBarrier	copyFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// sType
			DE_NULL,									// pNext
			VK_ACCESS_TRANSFER_WRITE_BIT,				// srcAccessMask
			VK_ACCESS_HOST_READ_BIT,					// dstAccessMask
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*readImageBuffer,							// buffer
			0u,											// offset
			imageSizeBytes								// size
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuf));

	// Upload vertex data
	{
		const VkMappedMemoryRange	range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			vertexBufferMemory->getMemory(),		// memory
			0,										// offset
			(VkDeviceSize)sizeof(vertices),			// size
		};
		void*						vertexBufPtr	= vertexBufferMemory->getHostPtr();

		deMemcpy(vertexBufPtr, &vertices[0], sizeof(vertices));
		VK_CHECK(vk.flushMappedMemoryRanges(vkDevice, 1u, &range));
	}

	// Submit & wait for completion
	{
		const VkFenceCreateInfo	fenceParams	=
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// sType
			DE_NULL,								// pNext
			0u,										// flags
		};
		const VkSubmitInfo		submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,
			1u,										// commandBufferCount
			&cmdBuf.get(),							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL,								// pSignalSemaphores
		};
		const Unique<VkFence>	fence		(createFence(vk, vkDevice, &fenceParams));

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read results, render reference, compare
	{
		const tcu::TextureFormat			tcuFormat		= vk::mapVkFormat(colorFormat);
		const VkMappedMemoryRange			range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			readImageBufferMemory->getMemory(),		// memory
			0,										// offset
			imageSizeBytes,							// size
		};
		const tcu::ConstPixelBufferAccess	resultAccess	(tcuFormat, renderSize.x(), renderSize.y(), 1, readImageBufferMemory->getHostPtr());

		VK_CHECK(vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range));

		{
			tcu::TextureLevel	refImage		(tcuFormat, renderSize.x(), renderSize.y());
			const tcu::UVec4	threshold		(0u);
			const tcu::IVec3	posDeviation	(1,1,0);

			tcu::clear(refImage.getAccess(), clearColor);
			renderReferenceTriangle(refImage.getAccess(), vertices);

			if (tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(),
														  "ComparisonResult",
														  "Image comparison result",
														  refImage.getAccess(),
														  resultAccess,
														  threshold,
														  posDeviation,
														  false,
														  tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::pass("Rendering succeeded");
			else
				return tcu::TestStatus::fail("Image comparison failed");
		}
	}

	return tcu::TestStatus::pass("Rendering succeeded");
}